

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  int iVar1;
  int_type iVar2;
  element_type *peVar3;
  char_type local_11;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_10;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  this->chars_read = this->chars_read + 1;
  local_10 = this;
  if ((this->next_unget & 1U) == 0) {
    peVar3 = std::
             __shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    iVar1 = (**peVar3->_vptr_input_adapter_protocol)();
    this->current = iVar1;
  }
  else {
    this->next_unget = false;
  }
  iVar1 = this->current;
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    local_11 = std::char_traits<char>::to_char_type(&this->current);
    std::vector<char,_std::allocator<char>_>::push_back(&this->token_string,&local_11);
  }
  return this->current;
}

Assistant:

std::char_traits<char>::int_type get()
    {
        ++chars_read;
        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia->get_character();
        }

        if (JSON_LIKELY(current != std::char_traits<char>::eof()))
        {
            token_string.push_back(std::char_traits<char>::to_char_type(current));
        }
        return current;
    }